

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  uint uVar1;
  bool bVar2;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *this_00;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *this_01;
  reference ppPVar3;
  reference ppLVar4;
  reference puVar5;
  reference pvVar6;
  ulong uVar7;
  Tensor *in_RDI;
  float in_XMM0_Da;
  RealScalar RVar8;
  double dVar9;
  real g2_1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg_1;
  real *d2_1;
  uint i;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2_1;
  vector<float,_std::allocator<float>_> *hlgx;
  LookupParameters *p_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_1;
  real g2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  real *d2;
  Parameters *p_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  float gscale;
  LookupParameters *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range2;
  uint pi;
  float in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc8c;
  Trainer *in_stack_fffffffffffffc90;
  LookupParameters *in_stack_fffffffffffffcb0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffcb8;
  StorageBaseType *in_stack_fffffffffffffcc0;
  float *in_stack_fffffffffffffcc8;
  float *in_stack_fffffffffffffcd0;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffcd8;
  _Node_iterator_base<unsigned_int,_false> local_1f0;
  _Node_iterator_base<unsigned_int,_false> local_1e8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_1e0;
  reference local_1d8;
  LookupParameters *local_1d0;
  LookupParameters **local_1c8;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_1c0;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_1b8;
  float local_17c;
  RealScalar local_ac;
  float *local_60;
  Parameters *local_58;
  Parameters **local_50;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_48;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *local_40;
  float local_34;
  LookupParameters *local_30;
  LookupParameters **local_28;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_20;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_18;
  uint local_10;
  float local_c;
  
  local_10 = 0;
  local_c = in_XMM0_Da;
  if (((ulong)(in_RDI->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    this_00 = Model::parameters_list
                        ((Model *)(in_RDI->bs).
                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size(this_00);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0,(size_type)in_RDI)
    ;
    local_10 = 0;
    this_01 = Model::lookup_parameters_list
                        ((Model *)(in_RDI->bs).
                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size(this_01);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffcb0,(size_type)in_RDI);
    local_18 = Model::lookup_parameters_list
                         ((Model *)(in_RDI->bs).
                                   super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    local_20._M_current =
         (LookupParameters **)
         std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                   ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_28 = (LookupParameters **)
               std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                         ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                           *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (!bVar2) break;
      ppLVar4 = __gnu_cxx::
                __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                ::operator*(&local_20);
      local_30 = *ppLVar4;
      uVar7 = (ulong)local_10;
      local_10 = local_10 + 1;
      in_stack_fffffffffffffc90 =
           (Trainer *)
           std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)(in_RDI[1].d.d + 6),uVar7);
      (*(local_30->super_ParametersBase)._vptr_ParametersBase[3])();
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0,
                 (size_type)in_RDI);
      __gnu_cxx::
      __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
      ::operator++(&local_20);
    }
    *(undefined1 *)
     &(in_RDI->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 1;
  }
  local_34 = Trainer::clip_gradients(in_stack_fffffffffffffc90);
  local_10 = 0;
  local_40 = Model::parameters_list
                       ((Model *)(in_RDI->bs).
                                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  local_48._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_50 = (Parameters **)
             std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                       ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (!bVar2) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
              ::operator*(&local_48);
    local_58 = *ppPVar3;
    uVar7 = (ulong)local_10;
    local_10 = local_10 + 1;
    local_60 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 1),uVar7);
    Tensor::vec(in_RDI);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    Tensor::vec(in_RDI);
    local_ac = Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)in_stack_fffffffffffffcb0);
    *local_60 = *(float *)((long)&(in_RDI->bs).
                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) * *local_60 +
                (1.0 - *(float *)((long)&(in_RDI->bs).
                                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4)) * local_ac
    ;
    in_stack_fffffffffffffc8c = (float)(in_RDI->d).d[3] * local_c * local_34;
    dVar9 = std::sqrt((double)(ulong)(uint)(*local_60 +
                                           *(float *)&(in_RDI->bs).
                                                                                                            
                                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish));
    local_17c = in_stack_fffffffffffffc8c / SUB84(dVar9,0);
    Tensor::vec(in_RDI);
    Eigen::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+(in_stack_fffffffffffffcb8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)in_stack_fffffffffffffcb0);
    Tensor::vec(in_RDI);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffcb0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)in_RDI);
    Parameters::clear((Parameters *)0x6be209);
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_48);
  }
  local_10 = 0;
  local_1b8 = Model::lookup_parameters_list
                        ((Model *)(in_RDI->bs).
                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  local_1c0._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_1c8 = (LookupParameters **)
              std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                        ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (!bVar2) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
              ::operator*(&local_1c0);
    local_1d0 = *ppLVar4;
    uVar7 = (ulong)local_10;
    local_10 = local_10 + 1;
    local_1d8 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              *)(in_RDI[1].d.d + 6),uVar7);
    local_1e0 = &local_1d0->non_zero_grads;
    local_1e8._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_1f0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_1e8,&local_1f0);
      if (!bVar2) break;
      puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x6be332);
      uVar1 = *puVar5;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_1d8,(ulong)uVar1);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_1d0->values,(ulong)uVar1);
      Tensor::vec(in_RDI);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_1d0->grads,(ulong)uVar1);
      Tensor::vec(in_RDI);
      RVar8 = Eigen::
              MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)in_stack_fffffffffffffcb0);
      *pvVar6 = *(float *)((long)&(in_RDI->bs).
                                  super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4) * *pvVar6 +
                (1.0 - *(float *)((long)&(in_RDI->bs).
                                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4)) * RVar8;
      in_stack_fffffffffffffc88 = (float)(in_RDI->d).d[3] * local_c * local_34;
      std::sqrt((double)(ulong)(uint)(*pvVar6 +
                                     *(float *)&(in_RDI->bs).
                                                super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                                                ._M_impl.super__Vector_impl_data._M_finish));
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_1d0->grads,(ulong)uVar1);
      Tensor::vec(in_RDI);
      Eigen::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator+(in_stack_fffffffffffffcb8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)in_stack_fffffffffffffcb0);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_1d0->values,(ulong)uVar1);
      Tensor::vec(in_RDI);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator-=((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffcb0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)in_RDI);
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                ((_Node_iterator<unsigned_int,_true,_false> *)in_stack_fffffffffffffc90);
    }
    LookupParameters::clear(in_stack_fffffffffffffcb0);
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_1c0);
  }
  *(float *)&in_RDI->v = *(float *)&in_RDI->v + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}